

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.h
# Opt level: O0

void __thiscall TPZInt1Point::Point(TPZInt1Point *this,int ip,TPZVec<double> *pos,REAL *w)

{
  ostream *this_00;
  void *this_01;
  undefined8 *in_RCX;
  int in_ESI;
  
  if (in_ESI == 0) {
    *in_RCX = 0x3ff0000000000000;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"TPZInt1Point:: Bad number point ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void TPZInt1Point::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
#ifndef PZNODEBUG
	if(ip!=0) {
		std::cout << "TPZInt1Point:: Bad number point " << ip << std::endl;
		return;
	}
#endif
	w = 1.;
}